

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O0

void bool2int(BoolView *x,IntVar *y)

{
  long *in_RSI;
  BoolRelType in_stack_0000007c;
  BoolView *in_stack_00000080;
  int in_stack_00000098;
  IntRelType in_stack_0000009c;
  IntVar *in_stack_000000a0;
  BoolView *in_stack_ffffffffffffff88;
  BoolView *in_stack_ffffffffffffff90;
  undefined4 uVar1;
  undefined4 in_stack_ffffffffffffffa4;
  BoolView local_58 [2];
  undefined4 in_stack_ffffffffffffffc8;
  Lit in_stack_ffffffffffffffd4;
  
  int_rel(in_stack_000000a0,in_stack_0000009c,in_stack_00000098);
  uVar1 = 2;
  int_rel(in_stack_000000a0,in_stack_0000009c,in_stack_00000098);
  IntVar::specialiseToEL((IntVar *)CONCAT44(in_stack_ffffffffffffffa4,uVar1));
  BoolView::BoolView(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  uVar1 = (**(code **)(*in_RSI + 0x68))(in_RSI,1,uVar1);
  BoolView::BoolView((BoolView *)CONCAT44(uVar1,in_stack_ffffffffffffffc8),in_stack_ffffffffffffffd4
                    );
  BoolView::BoolView(local_58,in_stack_ffffffffffffff88);
  bool_rel(in_stack_00000080,in_stack_0000007c,x,(BoolView *)y);
  BoolView::~BoolView((BoolView *)0x26c455);
  BoolView::~BoolView((BoolView *)0x26c45f);
  BoolView::~BoolView((BoolView *)0x26c469);
  return;
}

Assistant:

void bool2int(BoolView x, IntVar* y) {
	int_rel(y, IRT_GE, 0);
	int_rel(y, IRT_LE, 1);
	y->specialiseToEL();
	bool_rel(std::move(x), BRT_EQ, BoolView(y->getLit(1, LR_GE)));
}